

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

unique_ptr<dap::Session,_std::default_delete<dap::Session>_> dap::Session::create(void)

{
  Impl *this;
  __uniq_ptr_data<dap::Session,_std::default_delete<dap::Session>,_true,_true> in_RDI;
  
  this = (Impl *)operator_new(0x350);
  memset(this,0,0x350);
  anon_unknown.dwarf_1f2fe16::Impl::Impl(this);
  std::unique_ptr<dap::Session,std::default_delete<dap::Session>>::
  unique_ptr<std::default_delete<dap::Session>,void>
            ((unique_ptr<dap::Session,std::default_delete<dap::Session>> *)
             in_RDI.super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
             super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
             super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl,(pointer)this);
  return (__uniq_ptr_data<dap::Session,_std::default_delete<dap::Session>,_true,_true>)
         (tuple<dap::Session_*,_std::default_delete<dap::Session>_>)
         in_RDI.super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
         super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
         super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Session> Session::create() {
  return std::unique_ptr<Session>(new Impl());
}